

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O3

void x25519_ge_scalarmult_base(ge_p3 *h,uint8_t *a)

{
  byte bVar1;
  uint32_t uVar2;
  long lVar3;
  char cVar4;
  char cVar5;
  ulong uVar6;
  int iVar7;
  undefined1 auVar8 [16];
  char e [64];
  ge_p1p1 r;
  ge_p2 s;
  ge_precomp t;
  char acStack_208 [63];
  char local_1c9;
  ge_p1p1 local_1c8;
  ge_p2 local_128;
  ge_precomp local_a8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  uVar2 = OPENSSL_get_ia32cap(2);
  if ((~uVar2 & 0x80108) == 0) {
    x25519_ge_scalarmult_base_adx((uint8_t (*) [32])&local_1c8,a);
    (h->X).v[0] = (ulong)(local_1c8.X.v[0]._6_1_ & 7) << 0x30 |
                  (ulong)local_1c8.X.v[0]._5_1_ << 0x28 | (ulong)(uint)local_1c8.X.v[0] |
                  (ulong)local_1c8.X.v[0]._4_1_ << 0x20;
    (h->X).v[1] = (ulong)(local_1c8.X.v[1]._4_1_ & 0x3f) << 0x2d |
                  (ulong)local_1c8.X.v[1]._3_1_ << 0x25 | (ulong)local_1c8.X.v[1]._2_1_ << 0x1d |
                  (ulong)local_1c8.X.v[1]._1_1_ << 0x15 | (ulong)(byte)local_1c8.X.v[1] << 0xd |
                  (ulong)local_1c8.X.v[0]._7_1_ << 5 | (ulong)(local_1c8.X.v[0]._6_1_ >> 3);
    (h->X).v[2] = ((ulong)((uint)local_1c8.X.v[2] & 0x1ffffff) << 0x1a |
                   (ulong)local_1c8.X.v[1]._7_1_ << 0x12 | (ulong)local_1c8.X.v[1]._6_1_ << 10) +
                  (ulong)local_1c8.X.v[1]._5_1_ * 4 | (ulong)(local_1c8.X.v[1]._4_1_ >> 6);
    (h->X).v[3] = ((ulong)(uint)local_1c8.X.v._22_4_ & 0xfffffff) << 0x17 |
                  (ulong)local_1c8.X.v[2]._5_1_ << 0xf | (ulong)local_1c8.X.v[2]._4_1_ << 7 |
                  (ulong)((uint)local_1c8.X.v[2] >> 0x19);
    (h->X).v[4] = (ulong)((uint)local_1c8.X.v._22_4_ >> 0x1c) |
                  (ulong)local_1c8.X.v[3]._2_1_ << 4 |
                  (ulong)local_1c8.X.v[3]._3_1_ << 0xc | (ulong)local_1c8.X.v[3]._4_4_ << 0x14;
    (h->Y).v[0] = (ulong)(local_1c8.X.v[4]._6_1_ & 7) << 0x30 |
                  (ulong)local_1c8.X.v[4]._5_1_ << 0x28 | (ulong)(uint)local_1c8.X.v[4] |
                  (ulong)local_1c8.X.v[4]._4_1_ << 0x20;
    (h->Y).v[1] = (ulong)(local_1c8.Y.v[0]._4_1_ & 0x3f) << 0x2d |
                  (ulong)local_1c8.Y.v[0]._3_1_ << 0x25 | (ulong)local_1c8.Y.v[0]._2_1_ << 0x1d |
                  (ulong)local_1c8.Y.v[0]._1_1_ << 0x15 | (ulong)(byte)local_1c8.Y.v[0] << 0xd |
                  (ulong)local_1c8.X.v[4]._7_1_ << 5 | (ulong)(local_1c8.X.v[4]._6_1_ >> 3);
    (h->Y).v[2] = ((ulong)((uint)local_1c8.Y.v[1] & 0x1ffffff) << 0x1a |
                   (ulong)local_1c8.Y.v[0]._7_1_ << 0x12 | (ulong)local_1c8.Y.v[0]._6_1_ << 10) +
                  (ulong)local_1c8.Y.v[0]._5_1_ * 4 | (ulong)(local_1c8.Y.v[0]._4_1_ >> 6);
    (h->Y).v[3] = ((ulong)(uint)local_1c8.Y.v._14_4_ & 0xfffffff) << 0x17 |
                  (ulong)local_1c8.Y.v[1]._5_1_ << 0xf | (ulong)local_1c8.Y.v[1]._4_1_ << 7 |
                  (ulong)((uint)local_1c8.Y.v[1] >> 0x19);
    (h->Y).v[4] = (ulong)((uint)local_1c8.Y.v._14_4_ >> 0x1c) |
                  (ulong)local_1c8.Y.v[2]._2_1_ << 4 |
                  (ulong)local_1c8.Y.v[2]._3_1_ << 0xc | (ulong)local_1c8.Y.v[2]._4_4_ << 0x14;
    (h->Z).v[0] = (ulong)(local_1c8.Y.v[3]._6_1_ & 7) << 0x30 |
                  (ulong)local_1c8.Y.v[3]._5_1_ << 0x28 | (ulong)(uint)local_1c8.Y.v[3] |
                  (ulong)local_1c8.Y.v[3]._4_1_ << 0x20;
    (h->Z).v[1] = (ulong)(local_1c8.Y.v[4]._4_1_ & 0x3f) << 0x2d |
                  (ulong)local_1c8.Y.v[4]._3_1_ << 0x25 | (ulong)local_1c8.Y.v[4]._2_1_ << 0x1d |
                  (ulong)local_1c8.Y.v[4]._1_1_ << 0x15 | (ulong)(byte)local_1c8.Y.v[4] << 0xd |
                  (ulong)local_1c8.Y.v[3]._7_1_ << 5 | (ulong)(local_1c8.Y.v[3]._6_1_ >> 3);
    (h->Z).v[2] = ((ulong)((uint)local_1c8.Z.v[0] & 0x1ffffff) << 0x1a |
                   (ulong)local_1c8.Y.v[4]._7_1_ << 0x12 | (ulong)local_1c8.Y.v[4]._6_1_ << 10) +
                  (ulong)local_1c8.Y.v[4]._5_1_ * 4 | (ulong)(local_1c8.Y.v[4]._4_1_ >> 6);
    (h->Z).v[3] = ((ulong)(uint)local_1c8.Z.v._6_4_ & 0xfffffff) << 0x17 |
                  (ulong)local_1c8.Z.v[0]._5_1_ << 0xf | (ulong)local_1c8.Z.v[0]._4_1_ << 7 |
                  (ulong)((uint)local_1c8.Z.v[0] >> 0x19);
    (h->Z).v[4] = (ulong)((uint)local_1c8.Z.v._6_4_ >> 0x1c) |
                  (ulong)local_1c8.Z.v[1]._2_1_ << 4 |
                  (ulong)local_1c8.Z.v[1]._3_1_ << 0xc | (ulong)local_1c8.Z.v[1]._4_4_ << 0x14;
    (h->T).v[0] = (ulong)(local_1c8.Z.v[2]._6_1_ & 7) << 0x30 |
                  (ulong)local_1c8.Z.v[2]._5_1_ << 0x28 | (ulong)(uint)local_1c8.Z.v[2] |
                  (ulong)local_1c8.Z.v[2]._4_1_ << 0x20;
    (h->T).v[1] = (ulong)(local_1c8.Z.v[3]._4_1_ & 0x3f) << 0x2d |
                  (ulong)local_1c8.Z.v[3]._3_1_ << 0x25 | (ulong)local_1c8.Z.v[3]._2_1_ << 0x1d |
                  (ulong)local_1c8.Z.v[3]._1_1_ << 0x15 | (ulong)(byte)local_1c8.Z.v[3] << 0xd |
                  (ulong)local_1c8.Z.v[2]._7_1_ << 5 | (ulong)(local_1c8.Z.v[2]._6_1_ >> 3);
    (h->T).v[2] = ((ulong)((uint)local_1c8.Z.v[4] & 0x1ffffff) << 0x1a |
                   (ulong)local_1c8.Z.v[3]._7_1_ << 0x12 | (ulong)local_1c8.Z.v[3]._6_1_ << 10) +
                  (ulong)local_1c8.Z.v[3]._5_1_ * 4 | (ulong)(local_1c8.Z.v[3]._4_1_ >> 6);
    (h->T).v[3] = ((ulong)(uint)local_1c8._118_4_ & 0xfffffff) << 0x17 |
                  (ulong)local_1c8.Z.v[4]._5_1_ << 0xf | (ulong)local_1c8.Z.v[4]._4_1_ << 7 |
                  (ulong)((uint)local_1c8.Z.v[4] >> 0x19);
    (h->T).v[4] = (ulong)((uint)local_1c8._118_4_ >> 0x1c) |
                  (ulong)local_1c8.T.v[0]._2_1_ << 4 |
                  (ulong)local_1c8.T.v[0]._3_1_ << 0xc | (ulong)local_1c8.T.v[0]._4_4_ << 0x14;
  }
  else {
    lVar3 = 0;
    do {
      uVar6 = *(ulong *)(a + lVar3);
      bVar1 = (byte)(uVar6 >> 0x38);
      auVar16._8_6_ = 0;
      auVar16._0_8_ = uVar6;
      auVar16[0xe] = bVar1;
      auVar16[0xf] = bVar1 >> 4;
      auVar15._14_2_ = auVar16._14_2_;
      auVar15._8_5_ = 0;
      auVar15._0_8_ = uVar6;
      auVar15[0xd] = (char)(ushort)(uVar6 >> 0x34);
      auVar14._13_3_ = auVar15._13_3_;
      auVar14._8_4_ = 0;
      auVar14._0_8_ = uVar6;
      auVar14[0xc] = (char)(uVar6 >> 0x30);
      auVar13._12_4_ = auVar14._12_4_;
      auVar13._8_3_ = 0;
      auVar13._0_8_ = uVar6;
      bVar1 = (byte)(uVar6 >> 0x28);
      auVar13[0xb] = bVar1 >> 4;
      auVar12._11_5_ = auVar13._11_5_;
      auVar12._8_2_ = 0;
      auVar12._0_8_ = uVar6;
      auVar12[10] = bVar1;
      auVar11._10_6_ = auVar12._10_6_;
      auVar11[8] = 0;
      auVar11._0_8_ = uVar6;
      auVar11[9] = (char)((ushort)(uVar6 >> 0x20) >> 4);
      auVar10._9_7_ = auVar11._9_7_;
      auVar10[8] = (char)(uVar6 >> 0x20);
      auVar10._0_8_ = uVar6;
      auVar9._8_8_ = auVar10._8_8_;
      bVar1 = (byte)(uVar6 >> 0x18);
      auVar9[7] = bVar1 >> 4;
      auVar9[6] = bVar1;
      auVar9[5] = (char)((ushort)(uVar6 >> 0x10) >> 4);
      auVar9[4] = (char)(uVar6 >> 0x10);
      bVar1 = (byte)(uVar6 >> 8);
      auVar9[3] = bVar1 >> 4;
      auVar9[2] = bVar1;
      auVar9._0_2_ = (ushort)uVar6;
      auVar8._2_14_ = auVar9._2_14_;
      auVar8[0] = (undefined1)uVar6;
      auVar8[1] = (char)((ushort)uVar6 >> 4);
      *(undefined1 (*) [16])(acStack_208 + lVar3 * 2) = auVar8 & _DAT_002323b0;
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x20);
    lVar3 = 0;
    cVar4 = '\0';
    do {
      cVar5 = cVar4 + acStack_208[lVar3];
      bVar1 = cVar5 + 8;
      cVar4 = (char)bVar1 >> 4;
      acStack_208[lVar3] = cVar5 - (bVar1 & 0xf0);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x3f);
    local_1c9 = local_1c9 + cVar4;
    iVar7 = 0;
    (h->X).v[4] = 0;
    (h->X).v[2] = 0;
    (h->X).v[3] = 0;
    (h->X).v[0] = 0;
    (h->X).v[1] = 0;
    (h->Y).v[1] = 0;
    (h->Y).v[2] = 0;
    (h->Y).v[3] = 0;
    (h->Y).v[4] = 0;
    (h->Y).v[0] = 1;
    (h->Z).v[1] = 0;
    (h->Z).v[2] = 0;
    (h->Z).v[3] = 0;
    (h->Z).v[4] = 0;
    (h->Z).v[0] = 1;
    (h->T).v[0] = 0;
    (h->T).v[1] = 0;
    (h->T).v[2] = 0;
    (h->T).v[3] = 0;
    (h->T).v[4] = 0;
    uVar6 = 0xffffffffffffffff;
    do {
      table_select(&local_a8,iVar7,acStack_208[uVar6 + 2]);
      ge_madd(&local_1c8,h,&local_a8);
      x25519_ge_p1p1_to_p3(h,&local_1c8);
      uVar6 = uVar6 + 2;
      iVar7 = iVar7 + 1;
    } while (uVar6 < 0x3e);
    local_128.X.v[4] = (h->X).v[4];
    local_128.X.v[0] = (h->X).v[0];
    local_128.X.v[1] = (h->X).v[1];
    local_128.X.v[2] = (h->X).v[2];
    local_128.X.v[3] = (h->X).v[3];
    local_128.Y.v[0] = (h->Y).v[0];
    local_128.Y.v[1] = (h->Y).v[1];
    local_128.Y.v[2] = (h->Y).v[2];
    local_128.Y.v[3] = (h->Y).v[3];
    local_128.Y.v[4] = (h->Y).v[4];
    local_128.Z.v[0] = (h->Z).v[0];
    local_128.Z.v[1] = (h->Z).v[1];
    local_128.Z.v[2] = (h->Z).v[2];
    local_128.Z.v[3] = (h->Z).v[3];
    local_128.Z.v[4] = (h->Z).v[4];
    ge_p2_dbl(&local_1c8,&local_128);
    x25519_ge_p1p1_to_p2(&local_128,&local_1c8);
    ge_p2_dbl(&local_1c8,&local_128);
    x25519_ge_p1p1_to_p2(&local_128,&local_1c8);
    ge_p2_dbl(&local_1c8,&local_128);
    x25519_ge_p1p1_to_p2(&local_128,&local_1c8);
    ge_p2_dbl(&local_1c8,&local_128);
    x25519_ge_p1p1_to_p3(h,&local_1c8);
    uVar6 = 0xfffffffffffffffe;
    iVar7 = 0;
    do {
      table_select(&local_a8,iVar7,acStack_208[uVar6 + 2]);
      ge_madd(&local_1c8,h,&local_a8);
      x25519_ge_p1p1_to_p3(h,&local_1c8);
      uVar6 = uVar6 + 2;
      iVar7 = iVar7 + 1;
    } while (uVar6 < 0x3e);
  }
  return;
}

Assistant:

void x25519_ge_scalarmult_base(ge_p3 *h, const uint8_t a[32]) {
#if defined(BORINGSSL_FE25519_ADX)
  if (CRYPTO_is_BMI1_capable() && CRYPTO_is_BMI2_capable() &&
      CRYPTO_is_ADX_capable()) {
    uint8_t t[4][32];
    x25519_ge_scalarmult_base_adx(t, a);
    fiat_25519_from_bytes(h->X.v, t[0]);
    fiat_25519_from_bytes(h->Y.v, t[1]);
    fiat_25519_from_bytes(h->Z.v, t[2]);
    fiat_25519_from_bytes(h->T.v, t[3]);
    return;
  }
#endif
  signed char e[64];
  signed char carry;
  ge_p1p1 r;
  ge_p2 s;
  ge_precomp t;
  int i;

  for (i = 0; i < 32; ++i) {
    e[2 * i + 0] = (a[i] >> 0) & 15;
    e[2 * i + 1] = (a[i] >> 4) & 15;
  }
  // each e[i] is between 0 and 15
  // e[63] is between 0 and 7

  carry = 0;
  for (i = 0; i < 63; ++i) {
    e[i] += carry;
    carry = e[i] + 8;
    carry >>= 4;
    e[i] -= carry << 4;
  }
  e[63] += carry;
  // each e[i] is between -8 and 8

  ge_p3_0(h);
  for (i = 1; i < 64; i += 2) {
    table_select(&t, i / 2, e[i]);
    ge_madd(&r, h, &t);
    x25519_ge_p1p1_to_p3(h, &r);
  }

  ge_p3_dbl(&r, h);
  x25519_ge_p1p1_to_p2(&s, &r);
  ge_p2_dbl(&r, &s);
  x25519_ge_p1p1_to_p2(&s, &r);
  ge_p2_dbl(&r, &s);
  x25519_ge_p1p1_to_p2(&s, &r);
  ge_p2_dbl(&r, &s);
  x25519_ge_p1p1_to_p3(h, &r);

  for (i = 0; i < 64; i += 2) {
    table_select(&t, i / 2, e[i]);
    ge_madd(&r, h, &t);
    x25519_ge_p1p1_to_p3(h, &r);
  }
}